

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O1

void __thiscall
tchecker::details::statement_typechecker_t::visit
          (statement_typechecker_t *this,assign_statement_t *stmt)

{
  element_type *peVar1;
  long lVar2;
  integer_variables_t *piVar3;
  clock_variables_t *pcVar4;
  expression_t *expr;
  undefined8 uVar5;
  undefined8 uVar6;
  assign_statement_t *paVar7;
  long *plVar8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var9;
  typed_assign_statement_t *ptVar10;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  statement_type_t stmt_type;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> typed_lvalue;
  shared_ptr<const_tchecker::typed_expression_t> typed_rvalue;
  statement_type_t local_10c;
  undefined1 local_108 [32];
  shared_ptr<const_tchecker::typed_lvalue_expression_t> local_e8;
  shared_ptr<const_tchecker::typed_expression_t> local_d8;
  shared_ptr<const_tchecker::typed_lvalue_expression_t> local_c8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_b8;
  assign_statement_t *local_a8;
  _Any_data *local_a0;
  integer_variables_t *local_98;
  string local_90;
  _Any_data local_70;
  code *local_60;
  _Any_data local_50;
  code *local_40;
  
  peVar1 = (stmt->_lvalue).
           super___shared_ptr<const_tchecker::lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
           _M_ptr;
  lVar2 = *(long *)((long)*peVar1 + -0x38);
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  local_a0 = (_Any_data *)&this->_error;
  local_a8 = stmt;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_50,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_a0);
  local_98 = &this->_localvars;
  typecheck((tchecker *)local_108,(expression_t *)((long)&peVar1->field_0x0 + lVar2),
            &this->_localvars,piVar3,pcVar4,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_50);
  if ((typed_assign_statement_t *)local_108._0_8_ == (typed_assign_statement_t *)0x0) {
    local_e8.
    super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
  }
  else {
    local_e8.
    super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)
           __dynamic_cast(local_108._0_8_,&typed_expression_t::typeinfo,
                          &typed_lvalue_expression_t::typeinfo,0);
  }
  paVar7 = local_a8;
  if (local_e8.
      super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr == (element_type *)0x0) {
    local_e8.
    super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = (element_type *)0x0;
    local_e8.
    super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  }
  else {
    local_e8.
    super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_108._8_8_ + 8) = *(_Atomic_word *)(local_108._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_108._8_8_ + 8) = *(_Atomic_word *)(local_108._8_8_ + 8) + 1;
      }
    }
  }
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
  }
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  expr = (paVar7->_rvalue).
         super___shared_ptr<const_tchecker::expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  piVar3 = this->_intvars;
  pcVar4 = this->_clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)&local_70,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)local_a0);
  typecheck((tchecker *)local_108,expr,local_98,piVar3,pcVar4,
            (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
             *)&local_70);
  local_d8.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)local_108._0_8_;
  local_d8.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
  local_108._0_8_ = (typed_assign_statement_t *)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_60 != (code *)0x0) {
    (*local_60)(&local_70,&local_70,__destroy_functor);
  }
  local_10c = type_assign(((local_e8.
                            super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr)->super_typed_expression_t)._type,
                          (((typed_assign_statement_t *)
                           &(local_d8.
                             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr)->field_0x0)->super_typed_statement_t)._type);
  if (local_10c == STMT_TYPE_CLKASSIGN_INT) {
    local_108._0_8_ = (typed_assign_statement_t *)0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
    __shared_count<tchecker::typed_int_to_clock_assign_statement_t,std::allocator<tchecker::typed_int_to_clock_assign_statement_t>,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
               (typed_int_to_clock_assign_statement_t **)local_108,
               (allocator<tchecker::typed_int_to_clock_assign_statement_t> *)&local_c8,&local_10c,
               &local_e8,&local_d8);
  }
  else {
    if (local_10c == STMT_TYPE_CLKASSIGN_CLK) {
      if ((typed_assign_statement_t *)
          local_d8.
          super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          == (typed_assign_statement_t *)0x0) {
        local_c8.
        super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
      }
      else {
        local_c8.
        super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)
                 __dynamic_cast(local_d8.
                                super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                                ._M_ptr,&typed_expression_t::typeinfo,
                                &typed_lvalue_expression_t::typeinfo,0);
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
          local_c8.
          super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr == (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        local_c8.
        super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr = (element_type *)0x0;
        local_c8.
        super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      else {
        local_c8.
        super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             local_d8.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if (local_d8.
            super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_d8.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_d8.
                  super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_d8.
             super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_d8.
                  super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
      }
      local_108._0_8_ = (typed_assign_statement_t *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<tchecker::typed_clock_to_clock_assign_statement_t,std::allocator<tchecker::typed_clock_to_clock_assign_statement_t>,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                 (typed_clock_to_clock_assign_statement_t **)local_108,
                 (allocator<tchecker::typed_clock_to_clock_assign_statement_t> *)&local_90,
                 &local_10c,&local_e8,&local_c8);
      uVar6 = local_108._8_8_;
      uVar5 = local_108._0_8_;
      local_108._0_8_ = (typed_assign_statement_t *)0x0;
      local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      p_Var9 = (this->_typed_stmt).
               super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi;
      (this->_typed_stmt).
      super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)uVar5;
      (this->_typed_stmt).
      super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
      if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
      }
      this_00._M_pi =
           local_c8.
           super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
        this_00._M_pi =
             local_c8.
             super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
      }
      goto LAB_001547fe;
    }
    if (local_10c == STMT_TYPE_CLKASSIGN_SUM) {
      local_108._0_8_ = (typed_assign_statement_t *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<tchecker::typed_sum_to_clock_assign_statement_t,std::allocator<tchecker::typed_sum_to_clock_assign_statement_t>,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                 (typed_sum_to_clock_assign_statement_t **)local_108,
                 (allocator<tchecker::typed_sum_to_clock_assign_statement_t> *)&local_c8,&local_10c,
                 &local_e8,&local_d8);
    }
    else {
      local_108._0_8_ = (typed_assign_statement_t *)0x0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
      __shared_count<tchecker::typed_assign_statement_t,std::allocator<tchecker::typed_assign_statement_t>,tchecker::statement_type_t&,std::shared_ptr<tchecker::typed_lvalue_expression_t_const>&,std::shared_ptr<tchecker::typed_expression_t_const>&>
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_108 + 8),
                 (typed_assign_statement_t **)local_108,
                 (allocator<tchecker::typed_assign_statement_t> *)&local_c8,&local_10c,&local_e8,
                 &local_d8);
    }
  }
  uVar6 = local_108._8_8_;
  uVar5 = local_108._0_8_;
  local_108._0_8_ = (typed_assign_statement_t *)0x0;
  local_108._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var9 = (this->_typed_stmt).
           super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)uVar5;
  (this->_typed_stmt).super___shared_ptr<tchecker::typed_statement_t,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
  this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
  if (p_Var9 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var9);
    this_00._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_;
  }
LAB_001547fe:
  if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
  }
  if (((local_10c == STMT_TYPE_BAD) &&
      (((local_e8.
         super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr)->super_typed_expression_t)._type != EXPR_TYPE_BAD)) &&
     ((((typed_assign_statement_t *)
       &(local_d8.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr)->field_0x0)->super_typed_statement_t)._type != STMT_TYPE_BAD)) {
    statement_t::to_string_abi_cxx11_
              (&local_90,
               (statement_t *)((long)&paVar7->field_0x0 + *(long *)(*(long *)paVar7 + -0x38)));
    plVar8 = (long *)std::__cxx11::string::replace((ulong)&local_90,0,(char *)0x0,0x1bc0f4);
    p_Var9 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar8 + 2);
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar8 == p_Var9) {
      local_b8._vptr__Sp_counted_base = p_Var9->_vptr__Sp_counted_base;
      local_b8._8_8_ = plVar8[3];
      local_c8.
      super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)&local_b8;
    }
    else {
      local_b8._vptr__Sp_counted_base = p_Var9->_vptr__Sp_counted_base;
      local_c8.
      super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_ptr = (element_type *)*plVar8;
    }
    local_c8.
    super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar8[1];
    *plVar8 = (long)p_Var9;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_c8);
    ptVar10 = (typed_assign_statement_t *)(plVar8 + 2);
    if ((typed_assign_statement_t *)*plVar8 == ptVar10) {
      local_108._16_8_ =
           *(undefined8 *)
            &((typed_assign_statement_t *)&ptVar10->super_typed_statement_t)->
             super_typed_statement_t;
      local_108._24_4_ = (undefined4)plVar8[3];
      local_108._28_4_ = *(undefined4 *)((long)plVar8 + 0x1c);
      local_108._0_8_ = (typed_assign_statement_t *)(local_108 + 0x10);
    }
    else {
      local_108._16_8_ =
           *(undefined8 *)
            &((typed_assign_statement_t *)&ptVar10->super_typed_statement_t)->
             super_typed_statement_t;
      local_108._0_8_ = (typed_assign_statement_t *)*plVar8;
    }
    local_108._8_8_ = plVar8[1];
    *plVar8 = (long)ptVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    if ((this->_error).super__Function_base._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(this->_error)._M_invoker)
              (local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        local_108);
    if ((typed_assign_statement_t *)local_108._0_8_ !=
        (typed_assign_statement_t *)(local_108 + 0x10)) {
      operator_delete((void *)local_108._0_8_,local_108._16_8_ + 1);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
        local_c8.
        super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr != &local_b8) {
      operator_delete(local_c8.
                      super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr,(long)local_b8._vptr__Sp_counted_base + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
  }
  if (local_d8.super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_d8.
               super___shared_ptr<const_tchecker::typed_expression_t,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  if (local_e8.
      super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_e8.
               super___shared_ptr<const_tchecker::typed_lvalue_expression_t,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

virtual void visit(tchecker::assign_statement_t const & stmt)
  {
    // Left and right values
    auto typed_lvalue = std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(
        tchecker::typecheck(stmt.lvalue(), _localvars, _intvars, _clocks, _error));

    std::shared_ptr<tchecker::typed_expression_t const> typed_rvalue =
        tchecker::typecheck(stmt.rvalue(), _localvars, _intvars, _clocks, _error);

    // Typed statement
    enum tchecker::statement_type_t stmt_type = type_assign(typed_lvalue->type(), typed_rvalue->type());

    switch (stmt_type) {
    case STMT_TYPE_CLKASSIGN_INT:
      _typed_stmt = std::make_shared<tchecker::typed_int_to_clock_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    case STMT_TYPE_CLKASSIGN_CLK:
      _typed_stmt = std::make_shared<tchecker::typed_clock_to_clock_assign_statement_t>(
          stmt_type, typed_lvalue, std::dynamic_pointer_cast<tchecker::typed_lvalue_expression_t const>(typed_rvalue));
      break;
    case STMT_TYPE_CLKASSIGN_SUM:
      _typed_stmt = std::make_shared<tchecker::typed_sum_to_clock_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    default: // either STMT_TYPE_INTASSIGN or STMT_TYPE_BAD
      _typed_stmt = std::make_shared<tchecker::typed_assign_statement_t>(stmt_type, typed_lvalue, typed_rvalue);
      break;
    }

    // Report bad type
    if (stmt_type != tchecker::STMT_TYPE_BAD)
      return;

    if ((typed_lvalue->type() != tchecker::EXPR_TYPE_BAD) && (typed_rvalue->type() != tchecker::EXPR_TYPE_BAD))
      _error("in statement " + stmt.to_string() + ", invalid assignement");
  }